

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O2

int __thiscall SimpleLogger::LogElem::flush(LogElem *this,ofstream *fs)

{
  bool bVar1;
  int iVar2;
  Status exp;
  
  bVar1 = std::atomic<SimpleLogger::LogElem::Status>::compare_exchange_strong
                    (&this->status,&exp,FLUSHING,memory_order_seq_cst);
  if (bVar1) {
    std::ostream::write((char *)fs,(long)this->ctx);
    iVar2 = 0;
    LOCK();
    (this->status)._M_i = CLEAN;
    UNLOCK();
  }
  else {
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int SimpleLogger::LogElem::flush(std::ofstream& fs) {
    Status exp = DIRTY;
    Status val = FLUSHING;
    if (!status.compare_exchange_strong(exp, val)) return -1;

    fs.write(ctx, len);

    status.store(LogElem::CLEAN);
    return 0;
}